

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion_facade.h
# Opt level: O0

void gm_dealloc_data(GlobalMotionData *gm_data)

{
  long in_RDI;
  int m;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int iVar1;
  
  aom_free((void *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  *(undefined8 *)(in_RDI + 0x40) = 0;
  for (iVar1 = 0; iVar1 < 1; iVar1 = iVar1 + 1) {
    aom_free((void *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
    *(undefined8 *)(in_RDI + (long)iVar1 * 0x40 + 0x30) = 0;
  }
  return;
}

Assistant:

static inline void gm_dealloc_data(GlobalMotionData *gm_data) {
  aom_free(gm_data->segment_map);
  gm_data->segment_map = NULL;
  for (int m = 0; m < RANSAC_NUM_MOTIONS; m++) {
    aom_free(gm_data->motion_models[m].inliers);
    gm_data->motion_models[m].inliers = NULL;
  }
}